

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

int __thiscall
RuntimeVariableSymbol::clone
          (RuntimeVariableSymbol *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Alloc_hider local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::
  make_shared<RuntimeVariableSymbol,std::__cxx11::string_const&,TypeName_const&,std::shared_ptr<ExpressionNode>const&,Context_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe8,(TypeName *)(__fn + 8),
             (shared_ptr<ExpressionNode> *)(__fn + 0x28),(Context *)(__fn + 0x30));
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_RuntimeSymbol)._vptr_RuntimeSymbol = (_func_int **)local_18._M_p;
  (this->name_)._M_dataplus._M_p = (pointer)_Var1._M_pi;
  local_18._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xfffffffffffffff0);
  return (int)this;
}

Assistant:

std::shared_ptr<RuntimeSymbol> RuntimeVariableSymbol::clone(const Context& context) const
{
  return std::make_shared<RuntimeVariableSymbol>(name_, type_, value_, context);
}